

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::ConsoleReporter::AssertionPrinter::AssertionPrinter
          (AssertionPrinter *this,ostream *_stream,AssertionStats *_stats,bool _printInfoMessages)

{
  string *psVar1;
  string *psVar2;
  OfType OVar3;
  pointer pcVar4;
  long lVar5;
  char *pcVar6;
  Code CVar7;
  bool bVar8;
  
  this->stream = _stream;
  this->stats = _stats;
  this->result = &_stats->assertionResult;
  this->colour = None;
  psVar1 = &this->passOrFail;
  (this->passOrFail)._M_dataplus._M_p = (pointer)&(this->passOrFail).field_2;
  (this->passOrFail)._M_string_length = 0;
  (this->passOrFail).field_2._M_local_buf[0] = '\0';
  psVar2 = &this->messageLabel;
  (this->messageLabel)._M_dataplus._M_p = (pointer)&(this->messageLabel).field_2;
  (this->messageLabel)._M_string_length = 0;
  (this->messageLabel).field_2._M_local_buf[0] = '\0';
  (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
  pcVar4 = (_stats->assertionResult).m_resultData.message._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message,pcVar4,
             pcVar4 + (_stats->assertionResult).m_resultData.message._M_string_length);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->messages,&_stats->infoMessages);
  this->printInfoMessages = _printInfoMessages;
  OVar3 = (this->result->m_resultData).resultType;
  if (ExpressionFailed < OVar3) {
    if (OVar3 < ThrewException) {
      if (OVar3 != ExplicitFailure) {
        if (OVar3 != Exception) {
          return;
        }
        goto switchD_00161a25_caseD_ffffffff;
      }
      std::__cxx11::string::_M_replace
                ((ulong)psVar1,0,(char *)(this->passOrFail)._M_string_length,0x18eb91);
      this->colour = BrightRed;
      lVar5 = (long)(_stats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(_stats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      if (lVar5 == 0x78) {
        std::__cxx11::string::_M_replace
                  ((ulong)psVar2,0,(char *)(this->messageLabel)._M_string_length,0x18ec24);
        lVar5 = (long)(_stats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(_stats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_start;
      }
      if ((ulong)((lVar5 >> 3) * -0x1111111111111111) < 2) {
        return;
      }
      pcVar6 = "explicitly with messages";
    }
    else if (OVar3 == ThrewException) {
      this->colour = BrightRed;
      std::__cxx11::string::_M_replace
                ((ulong)psVar1,0,(char *)(this->passOrFail)._M_string_length,0x18eb91);
      pcVar6 = "due to unexpected exception with message";
    }
    else if (OVar3 == DidntThrowException) {
      this->colour = BrightRed;
      std::__cxx11::string::_M_replace
                ((ulong)psVar1,0,(char *)(this->passOrFail)._M_string_length,0x18eb91);
      pcVar6 = "because no exception was thrown where one was expected";
    }
    else {
      if (OVar3 != FatalErrorCondition) {
        return;
      }
      this->colour = BrightRed;
      std::__cxx11::string::_M_replace
                ((ulong)psVar1,0,(char *)(this->passOrFail)._M_string_length,0x18eb91);
      pcVar6 = "due to a fatal error condition";
    }
    goto LAB_00161d05;
  }
  switch(OVar3) {
  case Ok:
    this->colour = Green;
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(this->passOrFail)._M_string_length,0x18eb76);
    lVar5 = (long)(_stats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_stats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (lVar5 == 0x78) {
      std::__cxx11::string::_M_replace
                ((ulong)psVar2,0,(char *)(this->messageLabel)._M_string_length,0x18ebb4);
LAB_00161b75:
      lVar5 = (long)(_stats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(_stats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    }
    break;
  case Info:
    pcVar6 = "info";
    goto LAB_00161d05;
  case Warning:
    pcVar6 = "warning";
    goto LAB_00161d05;
  case Unknown:
switchD_00161a25_caseD_ffffffff:
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(this->passOrFail)._M_string_length,0x18ec55);
    this->colour = BrightRed;
    return;
  default:
    if (OVar3 == FailureBit) goto switchD_00161a25_caseD_ffffffff;
    if (OVar3 != ExpressionFailed) {
      return;
    }
    bVar8 = ((this->result->m_info).resultDisposition & SuppressFail) == 0;
    CVar7 = Green;
    if (bVar8) {
      CVar7 = BrightRed;
    }
    pcVar6 = "FAILED - but was ok";
    if (bVar8) {
      pcVar6 = "FAILED";
    }
    this->colour = CVar7;
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(this->passOrFail)._M_string_length,(ulong)pcVar6);
    lVar5 = (long)(_stats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_stats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (lVar5 == 0x78) {
      std::__cxx11::string::_M_replace
                ((ulong)psVar2,0,(char *)(this->messageLabel)._M_string_length,0x18ebb4);
      goto LAB_00161b75;
    }
  }
  if ((ulong)((lVar5 >> 3) * -0x1111111111111111) < 2) {
    return;
  }
  pcVar6 = "with messages";
LAB_00161d05:
  std::__cxx11::string::_M_replace
            ((ulong)psVar2,0,(char *)(this->messageLabel)._M_string_length,(ulong)pcVar6);
  return;
}

Assistant:

AssertionPrinter( std::ostream& _stream, AssertionStats const& _stats, bool _printInfoMessages )
            :   stream( _stream ),
                stats( _stats ),
                result( _stats.assertionResult ),
                colour( Colour::None ),
                message( result.getMessage() ),
                messages( _stats.infoMessages ),
                printInfoMessages( _printInfoMessages )
            {
                switch( result.getResultType() ) {
                    case ResultWas::Ok:
                        colour = Colour::Success;
                        passOrFail = "PASSED";
                        //if( result.hasMessage() )
                        if( _stats.infoMessages.size() == 1 )
                            messageLabel = "with message";
                        if( _stats.infoMessages.size() > 1 )
                            messageLabel = "with messages";
                        break;
                    case ResultWas::ExpressionFailed:
                        if( result.isOk() ) {
                            colour = Colour::Success;
                            passOrFail = "FAILED - but was ok";
                        }
                        else {
                            colour = Colour::Error;
                            passOrFail = "FAILED";
                        }
                        if( _stats.infoMessages.size() == 1 )
                            messageLabel = "with message";
                        if( _stats.infoMessages.size() > 1 )
                            messageLabel = "with messages";
                        break;
                    case ResultWas::ThrewException:
                        colour = Colour::Error;
                        passOrFail = "FAILED";
                        messageLabel = "due to unexpected exception with message";
                        break;
                    case ResultWas::FatalErrorCondition:
                        colour = Colour::Error;
                        passOrFail = "FAILED";
                        messageLabel = "due to a fatal error condition";
                        break;
                    case ResultWas::DidntThrowException:
                        colour = Colour::Error;
                        passOrFail = "FAILED";
                        messageLabel = "because no exception was thrown where one was expected";
                        break;
                    case ResultWas::Info:
                        messageLabel = "info";
                        break;
                    case ResultWas::Warning:
                        messageLabel = "warning";
                        break;
                    case ResultWas::ExplicitFailure:
                        passOrFail = "FAILED";
                        colour = Colour::Error;
                        if( _stats.infoMessages.size() == 1 )
                            messageLabel = "explicitly with message";
                        if( _stats.infoMessages.size() > 1 )
                            messageLabel = "explicitly with messages";
                        break;
                    // These cases are here to prevent compiler warnings
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        passOrFail = "** internal error **";
                        colour = Colour::Error;
                        break;
                }
            }